

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

bool __thiscall leveldb::Compaction::IsTrivialMove(Compaction *this)

{
  pointer ppFVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  if ((((long)this->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)this->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) == 8) &&
     (((long)this->inputs_[1].
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)this->inputs_[1].
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) == 0)) {
    ppFVar1 = (this->grandparents_).
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->grandparents_).
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1;
    if (lVar3 == 0) {
      lVar4 = 0;
    }
    else {
      lVar3 = lVar3 >> 3;
      lVar5 = 0;
      lVar4 = 0;
      do {
        lVar4 = lVar4 + ppFVar1[lVar5]->file_size;
        lVar5 = lVar5 + 1;
      } while (lVar3 + (ulong)(lVar3 == 0) != lVar5);
    }
    bVar2 = lVar4 <= (long)(this->input_version_->vset_->options_->max_file_size * 10);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool Compaction::IsTrivialMove() const {
  const VersionSet* vset = input_version_->vset_;
  // Avoid a move if there is lots of overlapping grandparent data.
  // Otherwise, the move could create a parent file that will require
  // a very expensive merge later on.
  return (num_input_files(0) == 1 && num_input_files(1) == 0 &&
          TotalFileSize(grandparents_) <=
              MaxGrandParentOverlapBytes(vset->options_));
}